

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int StopThreadRazorAHRSx(RAZORAHRS *pRazorAHRS)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = RazorAHRSCS;
  lVar1 = 0;
  do {
    if (*(RAZORAHRS **)((long)addrsRazorAHRS + lVar1 * 2) == pRazorAHRS) {
      *(undefined4 *)((long)bExitRazorAHRS + lVar1) = 1;
      pthread_join(*(pthread_t *)((long)RazorAHRSThreadId + lVar1 * 2),(void **)0x0);
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resRazorAHRS + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadRazorAHRSx(RAZORAHRS* pRazorAHRS)
{
	int id = 0;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitRazorAHRS[id] = TRUE;
	WaitForThread(RazorAHRSThreadId[id]);
	DeleteCriticalSection(&RazorAHRSCS[id]);
	resRazorAHRS[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}